

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::StringOutputStream::Next(StringOutputStream *this,void **data,int *size)

{
  bool bVar1;
  LogMessage *pLVar2;
  ulong uVar3;
  string *psVar4;
  int iVar5;
  LogFinisher local_61;
  LogMessage local_60;
  
  psVar4 = this->target_;
  if (psVar4 == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xa0);
    pLVar2 = internal::LogMessage::operator<<(&local_60,"CHECK failed: target_ != NULL: ");
    internal::LogFinisher::operator=(&local_61,pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
    psVar4 = this->target_;
  }
  iVar5 = (int)psVar4->_M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(psVar4->_M_dataplus)._M_p == &psVar4->field_2) {
    uVar3 = 0xf;
  }
  else {
    uVar3 = (psVar4->field_2)._M_allocated_capacity;
  }
  if (((ulong)(long)iVar5 < uVar3) || (iVar5 < 0x40000000)) {
    std::__cxx11::string::resize((ulong)psVar4);
    *data = (this->target_->_M_dataplus)._M_p + iVar5;
    *size = (int)this->target_->_M_string_length - iVar5;
    bVar1 = true;
  }
  else {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xad);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_60,"Cannot allocate buffer larger than kint32max for ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"StringOutputStream.");
    internal::LogFinisher::operator=(&local_61,pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool StringOutputStream::Next(void** data, int* size) {
  GOOGLE_CHECK(target_ != NULL);
  int old_size = target_->size();

  // Grow the string.
  if (old_size < target_->capacity()) {
    // Resize the string to match its capacity, since we can get away
    // without a memory allocation this way.
    STLStringResizeUninitialized(target_, target_->capacity());
  } else {
    // Size has reached capacity, try to double the size.
    if (old_size > std::numeric_limits<int>::max() / 2) {
      // Can not double the size otherwise it is going to cause integer
      // overflow in the expression below: old_size * 2 ";
      GOOGLE_LOG(ERROR) << "Cannot allocate buffer larger than kint32max for "
                 << "StringOutputStream.";
      return false;
    }
    // Double the size, also make sure that the new size is at least
    // kMinimumSize.
    STLStringResizeUninitialized(
        target_,
        std::max(old_size * 2,
                 kMinimumSize + 0));  // "+ 0" works around GCC4 weirdness.
  }

  *data = mutable_string_data(target_) + old_size;
  *size = target_->size() - old_size;
  return true;
}